

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_HermiteSurface::Create(ON_HermiteSurface *this,int u_count,int v_count)

{
  double *pdVar1;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar2;
  ON_3dVector *pOVar3;
  int local_6c;
  int j_2;
  ON_SimpleArray<ON_3dVector> *arr_3;
  int i_5;
  int j_1;
  ON_SimpleArray<ON_3dVector> *arr_2;
  int i_4;
  int j;
  ON_SimpleArray<ON_3dVector> *arr_1;
  int i_3;
  ON_SimpleArray<ON_3dPoint> *arr;
  int local_28;
  int i_2;
  int i_1;
  int i;
  int v_count_local;
  int u_count_local;
  ON_HermiteSurface *this_local;
  
  Destroy(this);
  if ((u_count < 2) || (v_count < 2)) {
    this_local._7_1_ = false;
  }
  else {
    this->m_u_count = u_count;
    this->m_v_count = v_count;
    ON_SimpleArray<double>::SetCapacity(&this->m_u_parameters,(long)this->m_u_count);
    ON_SimpleArray<double>::SetCount(&this->m_u_parameters,this->m_u_count);
    for (i_2 = 0; i_2 < this->m_u_count; i_2 = i_2 + 1) {
      pdVar1 = ON_SimpleArray<double>::operator[](&this->m_u_parameters,i_2);
      *pdVar1 = -1.23432101234321e+308;
    }
    ON_SimpleArray<double>::SetCapacity(&this->m_v_parameters,(long)this->m_v_count);
    ON_SimpleArray<double>::SetCount(&this->m_v_parameters,this->m_v_count);
    for (local_28 = 0; local_28 < this->m_v_count; local_28 = local_28 + 1) {
      pdVar1 = ON_SimpleArray<double>::operator[](&this->m_v_parameters,local_28);
      *pdVar1 = -1.23432101234321e+308;
    }
    ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::SetCapacity
              (&this->m_grid_points,(long)this->m_u_count);
    for (arr._4_4_ = 0; arr._4_4_ < this->m_u_count; arr._4_4_ = arr._4_4_ + 1) {
      this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::AppendNew(&this->m_grid_points);
      ON_SimpleArray<ON_3dPoint>::SetCapacity(this_00,(long)this->m_v_count);
      ON_SimpleArray<ON_3dPoint>::SetCount(this_00,this->m_v_count);
      ON_SimpleArray<ON_3dPoint>::Zero(this_00);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity
              (&this->m_u_tangents,(long)this->m_u_count);
    for (arr_1._4_4_ = 0; arr_1._4_4_ < this->m_u_count; arr_1._4_4_ = arr_1._4_4_ + 1) {
      pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_u_tangents);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar2,(long)this->m_v_count);
      ON_SimpleArray<ON_3dVector>::SetCount(pOVar2,this->m_v_count);
      for (arr_2._4_4_ = 0; arr_2._4_4_ < this->m_v_count; arr_2._4_4_ = arr_2._4_4_ + 1) {
        pOVar3 = ON_SimpleArray<ON_3dVector>::operator[](pOVar2,arr_2._4_4_);
        ON_3dVector::operator=(pOVar3,&ON_3dPoint::UnsetPoint);
      }
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity
              (&this->m_v_tangents,(long)this->m_u_count);
    for (arr_2._0_4_ = 0; (int)arr_2 < this->m_u_count; arr_2._0_4_ = (int)arr_2 + 1) {
      pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_v_tangents);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar2,(long)this->m_v_count);
      ON_SimpleArray<ON_3dVector>::SetCount(pOVar2,this->m_v_count);
      for (arr_3._4_4_ = 0; arr_3._4_4_ < this->m_v_count; arr_3._4_4_ = arr_3._4_4_ + 1) {
        pOVar3 = ON_SimpleArray<ON_3dVector>::operator[](pOVar2,arr_3._4_4_);
        pOVar3->x = ON_3dVector::UnsetVector.x;
        pOVar3->y = ON_3dVector::UnsetVector.y;
        pOVar3->z = ON_3dVector::UnsetVector.z;
      }
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_twists,(long)this->m_u_count);
    for (arr_3._0_4_ = 0; (int)arr_3 < this->m_u_count; arr_3._0_4_ = (int)arr_3 + 1) {
      pOVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_twists);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar2,(long)this->m_v_count);
      ON_SimpleArray<ON_3dVector>::SetCount(pOVar2,this->m_v_count);
      for (local_6c = 0; local_6c < this->m_v_count; local_6c = local_6c + 1) {
        pOVar3 = ON_SimpleArray<ON_3dVector>::operator[](pOVar2,local_6c);
        pOVar3->x = ON_3dVector::UnsetVector.x;
        pOVar3->y = ON_3dVector::UnsetVector.y;
        pOVar3->z = ON_3dVector::UnsetVector.z;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_HermiteSurface::Create(int u_count, int v_count)
{
  Destroy();

  if (u_count < 2 || v_count < 2)
    return false;

  m_u_count = u_count;
  m_v_count = v_count;

  m_u_parameters.SetCapacity(m_u_count);
  m_u_parameters.SetCount(m_u_count);
  for (int i = 0; i < m_u_count; i++)
    m_u_parameters[i] = ON_UNSET_VALUE;

  m_v_parameters.SetCapacity(m_v_count);
  m_v_parameters.SetCount(m_v_count);
  for (int i = 0; i < m_v_count; i++)
    m_v_parameters[i] = ON_UNSET_VALUE;

  m_grid_points.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dPoint>& arr = m_grid_points.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    arr.Zero();
  }

  m_u_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_u_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dPoint::UnsetPoint;
  }

  m_v_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_v_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  m_twists.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_twists.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  return true;
}